

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

bool __thiscall minja::ArgumentsValue::has_named(ArgumentsValue *this,string *name)

{
  pointer ppVar1;
  pointer ppVar2;
  __type_conflict1 _Var3;
  pointer __lhs;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
  *p;
  
  ppVar1 = (this->kwargs).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (this->kwargs).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    __lhs = ppVar2;
    if (__lhs == ppVar1) break;
    _Var3 = std::operator==(&__lhs->first,name);
    ppVar2 = __lhs + 1;
  } while (!_Var3);
  return __lhs != ppVar1;
}

Assistant:

bool has_named(const std::string & name) {
    for (const auto & p : kwargs) {
      if (p.first == name) return true;
    }
    return false;
  }